

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

QStringList * __thiscall
QDir::entryList(QStringList *__return_storage_ptr__,QDir *this,QStringList *nameFilters,
               Filters filters,SortFlags sort)

{
  QDirPrivate *this_00;
  Data *pDVar1;
  compare_eq_result_container<QList<QString>,_QString> cVar2;
  long in_FS_OFFSET;
  QDirListing dirList;
  QFileInfo local_68;
  DirEntry local_60;
  QArrayDataPointer<QFileInfo> local_58;
  QDirListing local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d.ptr;
  if ((QFlagsStorage<QDir::Filter>)
      filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i ==
      (QFlagsStorage<QDir::Filter>)0xffffffff) {
    filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i =
         (QFlagsStorageHelper<QDir::Filter,_4>)
         (this_00->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
         super_QFlagsStorage<QDir::Filter>.i;
  }
  if ((QFlagsStorage<QDir::SortFlag>)
      sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i ==
      (QFlagsStorage<QDir::SortFlag>)0xffffffff) {
    sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i =
         (QFlagsStorageHelper<QDir::SortFlag,_4>)
         (this_00->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
         super_QFlagsStorage<QDir::SortFlag>.i;
  }
  if ((filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i ==
       (QFlagsStorageHelper<QDir::Filter,_4>)
       (this_00->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
       super_QFlagsStorage<QDir::Filter>.i) &&
     (sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i ==
      (QFlagsStorageHelper<QDir::SortFlag,_4>)
      (this_00->sort).super_QFlagsStorageHelper<QDir::SortFlag,_4>.
      super_QFlagsStorage<QDir::SortFlag>.i)) {
    cVar2 = QList<QString>::operator==(nameFilters,&this_00->nameFilters);
    if ((cVar2) &&
       ((((uint)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.
                super_QFlagsStorage<QDir::SortFlag>.i & 3) != 3 ||
        (((this_00->fileCache).fileListsInitialized._M_base._M_i & 1U) != 0)))) {
      QDirPrivate::initFileLists(this_00,this);
      pDVar1 = (this_00->fileCache).files.d.d;
      (__return_storage_ptr__->d).d = pDVar1;
      (__return_storage_ptr__->d).ptr = (this_00->fileCache).files.d.ptr;
      (__return_storage_ptr__->d).size = (this_00->fileCache).files.d.size;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00226821;
    }
  }
  local_40.d = (QDirListingPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath((QString *)&local_58,&this_00->dirEntry);
  QDirListing::QDirListing
            (&local_40,(QString *)&local_58,nameFilters,
             (uint)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                   super_QFlagsStorage<QDir::Filter>.i,0);
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (((uint)sort.super_QFlagsStorageHelper<QDir::SortFlag,_4>.super_QFlagsStorage<QDir::SortFlag>.i
      & 3) == 3) {
    local_60.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_40);
    for (; local_60.dirListPtr != (QDirListingPrivate *)0x0; local_60 = QDirListing::next(local_60))
    {
      QDirListing::DirEntry::fileName((QString *)&local_58,&local_60);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QString *)&local_58);
      QList<QString>::end(__return_storage_ptr__);
      if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  else {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QFileInfo *)0x0;
    local_58.size = 0;
    local_60.dirListPtr = (QDirListingPrivate *)QDirListing::begin(&local_40);
    for (; local_60.dirListPtr != (QDirListingPrivate *)0x0; local_60 = QDirListing::next(local_60))
    {
      QDirListing::DirEntry::fileInfo((DirEntry *)&local_68);
      QtPrivate::QMovableArrayOps<QFileInfo>::emplace<QFileInfo>
                ((QMovableArrayOps<QFileInfo> *)&local_58,local_58.size,&local_68);
      QList<QFileInfo>::end((QList<QFileInfo> *)&local_58);
      QFileInfo::~QFileInfo(&local_68);
    }
    QDirPrivate::sortFileList
              (sort,(QFileInfoList *)&local_58,__return_storage_ptr__,(QFileInfoList *)0x0);
    QArrayDataPointer<QFileInfo>::~QArrayDataPointer(&local_58);
  }
  QDirListing::~QDirListing(&local_40);
LAB_00226821:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QDir::entryList(const QStringList &nameFilters, Filters filters,
                            SortFlags sort) const
{
    Q_D(const QDir);

    if (filters == NoFilter)
        filters = d->filters;
    if (sort == NoSort)
        sort = d->sort;

    const bool needsSorting = (sort & QDir::SortByMask) != QDir::Unsorted;

    if (filters == d->filters && sort == d->sort && nameFilters == d->nameFilters) {
        // Don't fill a QFileInfo cache if we just need names
        if (needsSorting || d->fileCache.fileListsInitialized) {
            d->initFileLists(*this);
            return d->fileCache.files;
        }
    }

    QDirListing dirList(d->dirEntry.filePath(), nameFilters, filters.toInt());
    QStringList ret;
    if (needsSorting) {
        QFileInfoList l;
        for (const auto &dirEntry : dirList)
            l.emplace_back(dirEntry.fileInfo());
        d->sortFileList(sort, l, &ret, nullptr);
    } else {
        for (const auto &dirEntry : dirList)
            ret.emplace_back(dirEntry.fileName());
    }
    return ret;
}